

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O1

cmJSONHelper<int> * __thiscall
cmJSONHelperBuilder::Required<int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>
          (cmJSONHelper<int> *__return_storage_ptr__,cmJSONHelperBuilder *this,ErrorGenerator *error
          ,function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *func)

{
  _Any_data _Stack_58;
  code *local_48;
  _Any_data local_38;
  code *local_28;
  
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::function
            ((function<void_(const_Json::Value_*,_cmJSONState_*)> *)&_Stack_58,
             (function<void_(const_Json::Value_*,_cmJSONState_*)> *)this);
  std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::function
            ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)&local_38,
             (function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)error);
  std::function<bool(int&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Required<int,std::function<bool(int&,Json::Value_const*,cmJSONState*)>>(std::function<void(Json::Value_const*,cmJSONState*)>const&,std::function<bool(int&,Json::Value_const*,cmJSONState*)>)::_lambda(int&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(int&,Json::Value_const*,cmJSONState*)> *)__return_storage_ptr__,
             (anon_class_64_2_4751a9fd *)&_Stack_58);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&_Stack_58,&_Stack_58,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<T> Required(const JsonErrors::ErrorGenerator& error,
                                  F func)
  {
    return [error, func](T& out, const Json::Value* value,
                         cmJSONState* state) -> bool {
      if (!value) {
        error(value, state);
        ;
        return false;
      }
      return func(out, value, state);
    };
  }